

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

void index_cat_helper(index_cat_info *info,index_stream *this)

{
  index_stream *this_00;
  index_stream *this_01;
  index_stream *right;
  index_stream *left;
  index_stream *this_local;
  index_cat_info *info_local;
  
  this_00 = (index_stream *)(this->node).left;
  this_01 = (index_stream *)(this->node).right;
  if (this_00 != (index_stream *)0x0) {
    index_cat_helper(info,this_00);
  }
  (this->node).uncompressed_base = info->uncompressed_size + (this->node).uncompressed_base;
  (this->node).compressed_base = info->file_size + (this->node).compressed_base;
  this->number = info->stream_number_add + this->number;
  this->block_number_base = info->block_number_add + this->block_number_base;
  index_tree_append(info->streams,&this->node);
  if (this_01 != (index_stream *)0x0) {
    index_cat_helper(info,this_01);
  }
  return;
}

Assistant:

static void
index_cat_helper(const index_cat_info *info, index_stream *this)
{
	index_stream *left = (index_stream *)(this->node.left);
	index_stream *right = (index_stream *)(this->node.right);

	if (left != NULL)
		index_cat_helper(info, left);

	this->node.uncompressed_base += info->uncompressed_size;
	this->node.compressed_base += info->file_size;
	this->number += info->stream_number_add;
	this->block_number_base += info->block_number_add;
	index_tree_append(info->streams, &this->node);

	if (right != NULL)
		index_cat_helper(info, right);

	return;
}